

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O1

void __thiscall
wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>::
noteExpressionOrCopy
          (StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner> *this,
          Expression *expr,HeapType type,Index index,LUBFinder *info)

{
  PassRunner *pPVar1;
  Module *module;
  uintptr_t uVar2;
  pointer pFVar3;
  uint uVar4;
  Expression *pEVar5;
  bool bVar6;
  Expression **ppEVar7;
  HeapType HVar8;
  Struct *pSVar9;
  Type TVar10;
  Expression *pEVar11;
  HeapType local_48;
  Type local_40;
  Type noted;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
           ).super_Pass.runner;
  module = (this->
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
           ).
           super_PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
           .
           super_Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
           .currModule;
  pEVar5 = expr;
  noted.id._4_4_ = index;
  do {
    pEVar11 = pEVar5;
    local_48.id = (uintptr_t)pEVar11;
    ppEVar7 = Properties::getImmediateFallthroughPtr
                        ((Expression **)&local_48,&pPVar1->options,module,NoTeeBrIf);
    uVar4 = noted.id._4_4_;
    pEVar5 = *ppEVar7;
  } while (*ppEVar7 != pEVar11);
  if ((pEVar11->type).id == (expr->type).id) {
    expr = pEVar11;
  }
  if ((((expr->_id != StructGetId) || (*(uint *)(expr + 1) != noted.id._4_4_)) ||
      (uVar2 = expr[1].type.id, *(long *)(uVar2 + 8) == 1)) ||
     (HVar8 = wasm::Type::getHeapType((Type *)(uVar2 + 8)), HVar8.id != type.id)) {
    local_40.id = (expr->type).id;
    local_48.id = type.id;
    pSVar9 = HeapType::getStruct(&local_48);
    pFVar3 = (pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar10.id = pFVar3[uVar4].type.id;
    if (((TVar10.id & 1) == 0 && 6 < TVar10.id) &&
       (bVar6 = wasm::Type::isExact(&pFVar3[uVar4].type), !bVar6)) {
      local_40 = wasm::Type::withInexactIfNoCustomDescs
                           (&local_40,
                            (FeatureSet)
                            (((this->
                              super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>_>
                              ).
                              super_PostWalker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                              .
                              super_Walker<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::LUBFinder,_wasm::(anonymous_namespace)::FieldInfoScanner>,_void>_>
                             .currModule)->features).features);
    }
    TVar10 = wasm::Type::getLeastUpperBound((info->lub).id,local_40);
    (info->lub).id = TVar10.id;
  }
  return;
}

Assistant:

void
  noteExpressionOrCopy(Expression* expr, HeapType type, Index index, T& info) {
    // Look at the value falling through, if it has the exact same type
    // (otherwise, we'd need to consider both the type actually written and the
    // type of the fallthrough, somehow).
    auto* fallthrough = Properties::getFallthrough(
      expr,
      this->getPassOptions(),
      *this->getModule(),
      static_cast<SubType*>(this)->getFallthroughBehavior());
    if (fallthrough->type == expr->type) {
      expr = fallthrough;
    }
    if (auto* get = expr->dynCast<StructGet>()) {
      if (get->index == index && get->ref->type != Type::unreachable &&
          get->ref->type.getHeapType() == type) {
        static_cast<SubType*>(this)->noteCopy(type, index, info);
        return;
      }
    }
    static_cast<SubType*>(this)->noteExpression(expr, type, index, info);
  }